

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int parse_range_dec64(char **str_num,uint8_t dig,int64_t *num)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  ushort **ppuVar5;
  int64_t iVar6;
  long lVar7;
  long lVar8;
  char cVar9;
  int iVar10;
  char *pcVar11;
  uint8_t exp;
  uint8_t uVar12;
  uint uVar13;
  char cVar14;
  ulong uVar15;
  char cVar16;
  
  uVar13 = (uint)dig;
  cVar1 = **str_num;
  pcVar11 = *str_num + ((cVar1 - 0x2bU & 0xfd) == 0);
  ppuVar5 = __ctype_b_loc();
  uVar15 = (ulong)*pcVar11;
  uVar3 = (*ppuVar5)[uVar15];
  if ((uVar3 >> 0xb & 1) == 0) {
    return 1;
  }
  cVar9 = -1;
  lVar7 = 0;
  cVar16 = '\0';
  exp = '\0';
  uVar12 = '\0';
  do {
    cVar14 = (char)uVar15;
    if ((uVar3 >> 0xb & 1) == 0) {
      if ((cVar14 != '.') || (-1 < cVar9)) {
LAB_00112989:
        if (cVar9 == '\0') {
          return 1;
        }
        if (cVar9 == -1) {
          cVar9 = '\0';
        }
        if (uVar12 != '\0') {
          cVar9 = cVar9 - uVar12;
          cVar16 = cVar16 - uVar12;
          iVar6 = dec_pow(exp);
          lVar7 = lVar7 / iVar6;
        }
        iVar10 = (int)cVar9;
        iVar4 = uVar13 - iVar10;
        if (iVar4 != 0 && iVar10 <= (int)uVar13) {
          if (0x12 < cVar16 + iVar4 + -1) {
            return 1;
          }
          iVar6 = dec_pow((uint8_t)iVar4);
          lVar7 = lVar7 * iVar6;
        }
        if ((int)uVar13 < iVar10) {
          return 1;
        }
        lVar8 = -lVar7;
        if (cVar1 != '-') {
          lVar8 = lVar7;
        }
        *str_num = pcVar11;
        *num = lVar8;
        return 0;
      }
      if ('\x12' < cVar16) {
        return 1;
      }
LAB_0011293d:
      bVar2 = pcVar11[1];
      if (bVar2 == 0x2e) goto LAB_00112989;
      cVar9 = cVar9 + '\x01';
    }
    else {
      if ('\x12' < cVar16) {
        return 1;
      }
      if (cVar14 == '.') goto LAB_0011293d;
      uVar12 = exp + '\x01';
      if (cVar14 != '0') {
        uVar12 = '\0';
      }
      lVar7 = lVar7 * 10 + (long)cVar14 + -0x30;
      if (-1 >= cVar9) {
        uVar12 = exp;
      }
      cVar9 = cVar9 + (-1 < cVar9);
      cVar16 = cVar16 + '\x01';
      bVar2 = pcVar11[1];
      exp = uVar12;
    }
    uVar15 = (ulong)bVar2;
    pcVar11 = pcVar11 + 1;
    uVar3 = (*ppuVar5)[(char)bVar2];
  } while( true );
}

Assistant:

int
parse_range_dec64(const char **str_num, uint8_t dig, int64_t *num)
{
    const char *ptr;
    int minus = 0;
    int64_t ret = 0;
    int8_t str_exp, str_dig = -1, trailing_zeros = 0;

    ptr = *str_num;

    if (ptr[0] == '-') {
        minus = 1;
        ++ptr;
    } else if (ptr[0] == '+') {
        ++ptr;
    }

    if (!isdigit(ptr[0])) {
        /* there must be at least one */
        return 1;
    }

    for (str_exp = 0; isdigit(ptr[0]) || ((ptr[0] == '.') && (str_dig < 0)); ++ptr) {
        if (str_exp > 18) {
            return 1;
        }

        if (ptr[0] == '.') {
            if (ptr[1] == '.') {
                /* it's the next interval */
                break;
            }
            ++str_dig;
        } else {
            ret = ret * 10 + (ptr[0] - '0');
            if (str_dig > -1) {
                ++str_dig;
                if (ptr[0] == '0') {
                    /* possibly trailing zero */
                    trailing_zeros++;
                } else {
                    trailing_zeros = 0;
                }
            }
            ++str_exp;
        }
    }
    if (str_dig == 0) {
        /* no digits after '.' */
        return 1;
    } else if (str_dig == -1) {
        /* there are 0 numbers after the floating point */
        str_dig = 0;
    }
    /* remove trailing zeros */
    if (trailing_zeros) {
        str_dig -= trailing_zeros;
        str_exp -= trailing_zeros;
        ret = ret / dec_pow(trailing_zeros);
    }

    /* it's parsed, now adjust the number based on fraction-digits, if needed */
    if (str_dig < dig) {
        if ((str_exp - 1) + (dig - str_dig) > 18) {
            return 1;
        }
        ret *= dec_pow(dig - str_dig);
    }
    if (str_dig > dig) {
        return 1;
    }

    if (minus) {
        ret *= -1;
    }
    *str_num = ptr;
    *num = ret;

    return 0;
}